

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_date_tests.cpp
# Opt level: O1

void __thiscall DateTests_canCreateDates_Test::TestBody(DateTests_canCreateDates_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  string *this_00;
  AssertionResult *pAVar3;
  char *pcVar4;
  char *in_R9;
  bool bVar5;
  bool bVar6;
  AssertionResult gtest_ar__4;
  Date date5;
  Date date4;
  AssertionResult gtest_ar__6;
  Date date7;
  Date date6;
  AssertionResult gtest_ar__7;
  Date date3;
  Date date9;
  Date date11;
  Date date8;
  Date date12;
  Date date10;
  Date date2;
  Date date1;
  string local_3d8;
  AssertHelper local_3b8;
  Date local_3b0;
  undefined1 local_368 [12];
  int32_t iStack_35c;
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_358;
  ComparableString local_320;
  Date local_300;
  Date local_2b8;
  AssertionResult local_270;
  undefined1 local_260 [12];
  int32_t iStack_254;
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_250;
  undefined1 local_218 [16];
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_208;
  undefined1 local_1d0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0 [3];
  undefined1 local_188 [16];
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_178;
  undefined1 local_140 [12];
  int iStack_134;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130 [3];
  undefined1 local_f8 [12];
  int iStack_ec;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8 [3];
  undefined1 local_b0 [12];
  int32_t iStack_a4;
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a0;
  Date local_68;
  
  this_00 = &local_3d8;
  local_b0._0_4_ = 0x7e1;
  local_260._0_4_ = 4;
  local_368._0_4_ = 0xc;
  database::Date::Date(&local_68,(int32_t *)local_b0,(int32_t *)local_260,(int32_t *)local_368);
  local_260._0_4_ = local_68.m_day;
  local_368._0_4_ = 0xc;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_b0,"date1.day()","12",(int *)local_260,(int *)local_368);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_260);
    if ((undefined8 *)CONCAT44(iStack_a4,local_b0._8_4_) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT44(iStack_a4,local_b0._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_368,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
               ,8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_368,(Message *)local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_368);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_260._0_8_ + 8))();
      }
      local_260._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_b0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    goto LAB_00109b43;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_b0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260._0_4_ = local_68.m_month;
  local_368._0_4_ = 4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_b0,"date1.month()","04",(int *)local_260,(int *)local_368);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_260);
    if ((undefined8 *)CONCAT44(iStack_a4,local_b0._8_4_) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT44(iStack_a4,local_b0._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_368,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
               ,9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_368,(Message *)local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_368);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_260._0_8_ + 8))();
      }
      local_260._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_b0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    goto LAB_00109b43;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_b0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260._0_4_ = local_68.m_year;
  local_368._0_4_ = 0x7e1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_b0,"date1.year()","2017",(int *)local_260,(int *)local_368);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_260);
    if ((undefined8 *)CONCAT44(iStack_a4,local_b0._8_4_) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT44(iStack_a4,local_b0._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_368,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
               ,10,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_368,(Message *)local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_368);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_260._0_8_ + 8))();
      }
      local_260._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_b0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    goto LAB_00109b43;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_b0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260._0_4_ = local_68.m_serialized_value;
  local_368._0_4_ = 0x133c6ac;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_b0,"date1.serialized_value()","20170412",(int *)local_260,
             (int *)local_368);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_260);
    if ((undefined8 *)CONCAT44(iStack_a4,local_b0._8_4_) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT44(iStack_a4,local_b0._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_368,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
               ,0xb,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_368,(Message *)local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_368);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_260._0_8_ + 8))();
      }
      local_260._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_b0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    goto LAB_00109b43;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_b0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260._0_4_ = 0x7d3;
  local_368._0_4_ = 0xc;
  local_3b0.m_day = 2;
  database::Date::Date((Date *)local_b0,(int32_t *)local_260,(int32_t *)local_368,&local_3b0.m_day);
  local_368._0_4_ = local_b0._0_4_;
  local_3b0.m_day = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_260,"date2.day()","02",(int *)local_368,&local_3b0.m_day);
  if (local_260[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_368);
    if ((undefined8 *)CONCAT44(iStack_254,local_260._8_4_) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT44(iStack_254,local_260._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
               ,0xe,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b0,(Message *)local_368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b0);
    if ((AssertHelperData *)local_368._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_368._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_368._0_8_ + 8))();
      }
      local_368._0_8_ = (AssertHelperData *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_260 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_260 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_368._0_4_ = local_b0._4_4_;
    local_3b0.m_day = 0xc;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_260,"date2.month()","12",(int *)local_368,&local_3b0.m_day);
    if (local_260[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_368);
      if ((undefined8 *)CONCAT44(iStack_254,local_260._8_4_) == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)CONCAT44(iStack_254,local_260._8_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_3b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                 ,0xf,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b0,(Message *)local_368);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b0);
      if ((AssertHelperData *)local_368._0_8_ != (AssertHelperData *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && ((AssertHelperData *)local_368._0_8_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_368._0_8_ + 8))();
        }
        local_368._0_8_ = (AssertHelperData *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_260 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_260 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_368._0_4_ = local_b0._8_4_;
      local_3b0.m_day = 0x7d3;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_260,"date2.year()","2003",(int *)local_368,&local_3b0.m_day);
      if (local_260[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_368);
        if ((undefined8 *)CONCAT44(iStack_254,local_260._8_4_) == (undefined8 *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)CONCAT44(iStack_254,local_260._8_4_);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_3b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                   ,0x10,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b0,(Message *)local_368);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b0);
        if ((AssertHelperData *)local_368._0_8_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && ((AssertHelperData *)local_368._0_8_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_368._0_8_ + 8))();
          }
          local_368._0_8_ = (AssertHelperData *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_260 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_260 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_368._0_4_ = iStack_a4;
        local_3b0.m_day = 0x131a6e2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_260,"date2.serialized_value()","20031202",(int *)local_368,
                   &local_3b0.m_day);
        if (local_260[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_368);
          if ((undefined8 *)CONCAT44(iStack_254,local_260._8_4_) == (undefined8 *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)CONCAT44(iStack_254,local_260._8_4_);
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_3b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                     ,0x11,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_3b0,(Message *)local_368);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b0);
          if ((AssertHelperData *)local_368._0_8_ != (AssertHelperData *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && ((AssertHelperData *)local_368._0_8_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_368._0_8_ + 8))();
            }
            local_368._0_8_ = (AssertHelperData *)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(local_260 + 8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(local_260 + 8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          local_368._0_4_ = 10;
          local_3b0.m_day = 5;
          local_2b8.m_day = 0x7ce;
          database::Date::Date
                    ((Date *)local_260,&local_2b8.m_day,(int32_t *)local_368,&local_3b0.m_day);
          local_3b0.m_day = local_260._0_4_;
          local_2b8.m_day = 5;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_368,"date3.day()","05",&local_3b0.m_day,&local_2b8.m_day);
          if (local_368[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_3b0);
            if ((undefined8 *)CONCAT44(iStack_35c,local_368._8_4_) == (undefined8 *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)CONCAT44(iStack_35c,local_368._8_4_);
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_2b8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                       ,0x14,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_2b8,(Message *)&local_3b0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b8);
            if ((AssertHelperData *)local_3b0._0_8_ != (AssertHelperData *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) && ((AssertHelperData *)local_3b0._0_8_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_3b0._0_8_ + 8))();
              }
              local_3b0._0_8_ = (AssertHelperData *)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_368 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_368 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_3b0.m_day = local_260._4_4_;
            local_2b8.m_day = 10;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_368,"date3.month()","10",&local_3b0.m_day,&local_2b8.m_day)
            ;
            if (local_368[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_3b0);
              if ((undefined8 *)CONCAT44(iStack_35c,local_368._8_4_) == (undefined8 *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = *(char **)CONCAT44(iStack_35c,local_368._8_4_);
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_2b8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                         ,0x15,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_2b8,(Message *)&local_3b0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b8);
              if ((AssertHelperData *)local_3b0._0_8_ != (AssertHelperData *)0x0) {
                bVar2 = testing::internal::IsTrue(true);
                if ((bVar2) && ((AssertHelperData *)local_3b0._0_8_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_3b0._0_8_ + 8))();
                }
                local_3b0._0_8_ = (AssertHelperData *)0x0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(local_368 + 8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(local_368 + 8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              local_3b0.m_day = local_260._8_4_;
              local_2b8.m_day = 0x7ce;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_368,"date3.year()","1998",&local_3b0.m_day,
                         &local_2b8.m_day);
              if (local_368[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_3b0);
                if ((undefined8 *)CONCAT44(iStack_35c,local_368._8_4_) == (undefined8 *)0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = *(char **)CONCAT44(iStack_35c,local_368._8_4_);
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_2b8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                           ,0x16,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_2b8,(Message *)&local_3b0);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b8);
                if ((AssertHelperData *)local_3b0._0_8_ != (AssertHelperData *)0x0) {
                  bVar2 = testing::internal::IsTrue(true);
                  if ((bVar2) && ((AssertHelperData *)local_3b0._0_8_ != (AssertHelperData *)0x0)) {
                    (**(code **)(*(long *)local_3b0._0_8_ + 8))();
                  }
                  local_3b0._0_8_ = (AssertHelperData *)0x0;
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)(local_368 + 8),
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)(local_368 + 8),
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                local_3b0.m_day = iStack_254;
                local_2b8.m_day = 0x130e2cd;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_368,"date3.serialized_value()","19981005",
                           &local_3b0.m_day,&local_2b8.m_day);
                if (local_368[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_3b0);
                  if ((undefined8 *)CONCAT44(iStack_35c,local_368._8_4_) == (undefined8 *)0x0) {
                    pcVar4 = "";
                  }
                  else {
                    pcVar4 = *(char **)CONCAT44(iStack_35c,local_368._8_4_);
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_2b8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                             ,0x17,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_2b8,(Message *)&local_3b0);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b8);
                  if ((AssertHelperData *)local_3b0._0_8_ != (AssertHelperData *)0x0) {
                    bVar2 = testing::internal::IsTrue(true);
                    if ((bVar2) && ((AssertHelperData *)local_3b0._0_8_ != (AssertHelperData *)0x0))
                    {
                      (**(code **)(*(long *)local_3b0._0_8_ + 8))();
                    }
                    local_3b0._0_8_ = (AssertHelperData *)0x0;
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)(local_368 + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)(local_368 + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  local_3b0.m_day = 0x7c2;
                  local_2b8.m_day = 7;
                  local_300.m_day = 0x1c;
                  database::Date::Date
                            ((Date *)local_368,&local_3b0.m_day,&local_2b8.m_day,&local_300.m_day);
                  local_2b8.m_day = local_368._0_4_;
                  local_300.m_day = 0x1c;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&local_3b0,"date4.day()","28",&local_2b8.m_day,
                             &local_300.m_day);
                  if (local_3b0.m_day._0_1_ == (internal)0x0) {
                    testing::Message::Message((Message *)&local_2b8);
                    if ((undefined8 *)CONCAT44(local_3b0.m_serialized_value,local_3b0.m_year) ==
                        (undefined8 *)0x0) {
                      pcVar4 = "";
                    }
                    else {
                      pcVar4 = *(char **)CONCAT44(local_3b0.m_serialized_value,local_3b0.m_year);
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_300,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                               ,0x1a,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_300,(Message *)&local_2b8);
LAB_00109af8:
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
                    testing::Message::~Message((Message *)&local_2b8);
                    testing::AssertionResult::~AssertionResult((AssertionResult *)&local_3b0);
                  }
                  else {
                    testing::AssertionResult::~AssertionResult((AssertionResult *)&local_3b0);
                    local_2b8.m_day = local_368._4_4_;
                    local_300.m_day = 7;
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)&local_3b0,"date4.month()","7",&local_2b8.m_day,
                               &local_300.m_day);
                    if (local_3b0.m_day._0_1_ == (internal)0x0) {
                      testing::Message::Message((Message *)&local_2b8);
                      if ((undefined8 *)CONCAT44(local_3b0.m_serialized_value,local_3b0.m_year) ==
                          (undefined8 *)0x0) {
                        pcVar4 = "";
                      }
                      else {
                        pcVar4 = *(char **)CONCAT44(local_3b0.m_serialized_value,local_3b0.m_year);
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_300,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                 ,0x1b,pcVar4);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_300,(Message *)&local_2b8);
                      goto LAB_00109af8;
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)&local_3b0);
                    local_2b8.m_day = local_368._8_4_;
                    local_300.m_day = 0x7c2;
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)&local_3b0,"date4.year()","1986",&local_2b8.m_day,
                               &local_300.m_day);
                    if (local_3b0.m_day._0_1_ == (internal)0x0) {
                      testing::Message::Message((Message *)&local_2b8);
                      if ((undefined8 *)CONCAT44(local_3b0.m_serialized_value,local_3b0.m_year) ==
                          (undefined8 *)0x0) {
                        pcVar4 = "";
                      }
                      else {
                        pcVar4 = *(char **)CONCAT44(local_3b0.m_serialized_value,local_3b0.m_year);
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_300,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                 ,0x1c,pcVar4);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_300,(Message *)&local_2b8);
                      goto LAB_00109af8;
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)&local_3b0);
                    local_2b8.m_day = iStack_35c;
                    local_300.m_day = 0x12f0cf8;
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)&local_3b0,"date4.serialized_value()","19860728",
                               &local_2b8.m_day,&local_300.m_day);
                    if (local_3b0.m_day._0_1_ == (internal)0x0) {
                      testing::Message::Message((Message *)&local_2b8);
                      if ((undefined8 *)CONCAT44(local_3b0.m_serialized_value,local_3b0.m_year) ==
                          (undefined8 *)0x0) {
                        pcVar4 = "";
                      }
                      else {
                        pcVar4 = *(char **)CONCAT44(local_3b0.m_serialized_value,local_3b0.m_year);
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_300,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                 ,0x1d,pcVar4);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_300,(Message *)&local_2b8);
                      goto LAB_00109af8;
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)&local_3b0);
                    local_2b8.m_day = 1;
                    local_300.m_day = 0xb;
                    local_188._0_4_ = 0x7d1;
                    database::Date::Date
                              (&local_3b0,(int32_t *)local_188,&local_300.m_day,&local_2b8.m_day);
                    local_300.m_day = local_3b0.m_day;
                    local_188._0_4_ = 1;
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)&local_2b8,"date5.day()","1",&local_300.m_day,
                               (int *)local_188);
                    if ((char)local_2b8.m_day == '\0') {
                      testing::Message::Message((Message *)&local_300);
                      if ((undefined8 *)CONCAT44(local_2b8.m_serialized_value,local_2b8.m_year) ==
                          (undefined8 *)0x0) {
                        pcVar4 = "";
                      }
                      else {
                        pcVar4 = *(char **)CONCAT44(local_2b8.m_serialized_value,local_2b8.m_year);
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)local_188,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                 ,0x20,pcVar4);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)local_188,(Message *)&local_300);
LAB_00109cd5:
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_188);
                      testing::Message::~Message((Message *)&local_300);
                      testing::AssertionResult::~AssertionResult((AssertionResult *)&local_2b8);
                    }
                    else {
                      testing::AssertionResult::~AssertionResult((AssertionResult *)&local_2b8);
                      local_300.m_day = local_3b0.m_month;
                      local_188._0_4_ = 0xb;
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)&local_2b8,"date5.month()","11",&local_300.m_day,
                                 (int *)local_188);
                      if ((char)local_2b8.m_day == '\0') {
                        testing::Message::Message((Message *)&local_300);
                        if ((undefined8 *)CONCAT44(local_2b8.m_serialized_value,local_2b8.m_year) ==
                            (undefined8 *)0x0) {
                          pcVar4 = "";
                        }
                        else {
                          pcVar4 = *(char **)CONCAT44(local_2b8.m_serialized_value,local_2b8.m_year)
                          ;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)local_188,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                   ,0x21,pcVar4);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)local_188,(Message *)&local_300);
                        goto LAB_00109cd5;
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)&local_2b8);
                      local_300.m_day = local_3b0.m_year;
                      local_188._0_4_ = 0x7d1;
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)&local_2b8,"date5.year()","2001",&local_300.m_day,
                                 (int *)local_188);
                      if ((char)local_2b8.m_day == '\0') {
                        testing::Message::Message((Message *)&local_300);
                        if ((undefined8 *)CONCAT44(local_2b8.m_serialized_value,local_2b8.m_year) ==
                            (undefined8 *)0x0) {
                          pcVar4 = "";
                        }
                        else {
                          pcVar4 = *(char **)CONCAT44(local_2b8.m_serialized_value,local_2b8.m_year)
                          ;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)local_188,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                   ,0x22,pcVar4);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)local_188,(Message *)&local_300);
                        goto LAB_00109cd5;
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)&local_2b8);
                      local_300.m_day = local_3b0.m_serialized_value;
                      local_188._0_4_ = 0x131585d;
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)&local_2b8,"date5.serialized_value()","20011101",
                                 &local_300.m_day,(int *)local_188);
                      if ((char)local_2b8.m_day == '\0') {
                        testing::Message::Message((Message *)&local_300);
                        if ((undefined8 *)CONCAT44(local_2b8.m_serialized_value,local_2b8.m_year) ==
                            (undefined8 *)0x0) {
                          pcVar4 = "";
                        }
                        else {
                          pcVar4 = *(char **)CONCAT44(local_2b8.m_serialized_value,local_2b8.m_year)
                          ;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)local_188,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                   ,0x23,pcVar4);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)local_188,(Message *)&local_300);
                        goto LAB_00109cd5;
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)&local_2b8);
                      local_300.m_day = 0x12240be;
                      database::Date::With_ddmmyyyy(&local_2b8,&local_300.m_day);
                      local_188._0_4_ = local_2b8.m_day;
                      local_218._0_4_ = 0x13;
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)&local_300,"date6.day()","19",(int *)local_188,
                                 (int *)local_218);
                      if ((char)local_300.m_day == '\0') {
                        testing::Message::Message((Message *)local_188);
                        if ((undefined8 *)CONCAT44(local_300.m_serialized_value,local_300.m_year) ==
                            (undefined8 *)0x0) {
                          pcVar4 = "";
                        }
                        else {
                          pcVar4 = *(char **)CONCAT44(local_300.m_serialized_value,local_300.m_year)
                          ;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)local_218,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                   ,0x26,pcVar4);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)local_218,(Message *)local_188);
LAB_00109e5c:
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_218);
                        testing::Message::~Message((Message *)local_188);
                        testing::AssertionResult::~AssertionResult((AssertionResult *)&local_300);
                      }
                      else {
                        testing::AssertionResult::~AssertionResult((AssertionResult *)&local_300);
                        local_188._0_4_ = local_2b8.m_month;
                        local_218._0_4_ = 2;
                        testing::internal::CmpHelperEQ<int,int>
                                  ((internal *)&local_300,"date6.month()","02",(int *)local_188,
                                   (int *)local_218);
                        if ((char)local_300.m_day == '\0') {
                          testing::Message::Message((Message *)local_188);
                          if ((undefined8 *)CONCAT44(local_300.m_serialized_value,local_300.m_year)
                              == (undefined8 *)0x0) {
                            pcVar4 = "";
                          }
                          else {
                            pcVar4 = *(char **)CONCAT44(local_300.m_serialized_value,
                                                        local_300.m_year);
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)local_218,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                     ,0x27,pcVar4);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)local_218,(Message *)local_188);
                          goto LAB_00109e5c;
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)&local_300);
                        local_188._0_4_ = local_2b8.m_year;
                        local_218._0_4_ = 0x7de;
                        testing::internal::CmpHelperEQ<int,int>
                                  ((internal *)&local_300,"date6.year()","2014",(int *)local_188,
                                   (int *)local_218);
                        if ((char)local_300.m_day == '\0') {
                          testing::Message::Message((Message *)local_188);
                          if ((undefined8 *)CONCAT44(local_300.m_serialized_value,local_300.m_year)
                              == (undefined8 *)0x0) {
                            pcVar4 = "";
                          }
                          else {
                            pcVar4 = *(char **)CONCAT44(local_300.m_serialized_value,
                                                        local_300.m_year);
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)local_218,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                     ,0x28,pcVar4);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)local_218,(Message *)local_188);
                          goto LAB_00109e5c;
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)&local_300);
                        local_188._0_4_ = local_2b8.m_serialized_value;
                        local_218._0_4_ = 0x13350bb;
                        testing::internal::CmpHelperEQ<int,int>
                                  ((internal *)&local_300,"date6.serialized_value()","20140219",
                                   (int *)local_188,(int *)local_218);
                        if ((char)local_300.m_day == '\0') {
                          testing::Message::Message((Message *)local_188);
                          if ((undefined8 *)CONCAT44(local_300.m_serialized_value,local_300.m_year)
                              == (undefined8 *)0x0) {
                            pcVar4 = "";
                          }
                          else {
                            pcVar4 = *(char **)CONCAT44(local_300.m_serialized_value,
                                                        local_300.m_year);
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)local_218,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                     ,0x29,pcVar4);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)local_218,(Message *)local_188);
                          goto LAB_00109e5c;
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)&local_300);
                        local_218._0_8_ =
                             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)&local_208;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_218,"20031202","");
                        local_188._0_8_ = &local_178;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)local_188,local_218._0_8_,
                                   (char *)(local_218._0_8_ +
                                           CONCAT44(local_218._12_4_,local_218._8_4_)));
                        database::Date::With_yyyymmdd(&local_300,(ComparableString *)local_188);
                        if ((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)local_188._0_8_ != &local_178) {
                          operator_delete((void *)local_188._0_8_,(long)local_178._M_buckets + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_218._0_8_ !=
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)&local_208) {
                          operator_delete((void *)local_218._0_8_,(long)local_208._M_buckets + 1);
                        }
                        local_218._0_4_ = 0x7d3;
                        local_f8._0_4_ = 0xc;
                        local_1d0._0_4_ = 2;
                        database::Date::Date
                                  ((Date *)local_188,(int32_t *)local_218,(int32_t *)local_f8,
                                   (int32_t *)local_1d0);
                        bVar2 = (_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 *)CONCAT44(local_300.m_month,local_300.m_day) ==
                                (_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 *)local_188._0_8_;
                        bVar5 = local_300.m_year == local_188._8_4_ && bVar2;
                        local_f8[0] = bVar5;
                        stack0xffffffffffffff10 =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                        if (bVar5) {
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
LAB_00109ea2:
                          database::Date::string_value((ComparableString *)local_218,&local_300);
                          database::Date::string_value
                                    ((ComparableString *)local_f8,(Date *)local_188);
                          bVar2 = database::ComparableString::operator==
                                            ((ComparableString *)local_218,
                                             (ComparableString *)local_f8);
                          local_1d0[0] = (string)bVar2;
                          local_1c8.ptr_ =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x0;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_f8._0_8_ != local_e8) {
                            operator_delete((void *)local_f8._0_8_,
                                            local_e8[0]._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_218._0_8_ !=
                              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)&local_208) {
                            operator_delete((void *)local_218._0_8_,(long)local_208._M_buckets + 1);
                          }
                          if (local_1d0[0] == (string)0x0) {
                            testing::Message::Message((Message *)local_f8);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_218,(internal *)local_1d0,
                                       (AssertionResult *)
                                       "date7.string_value() == date8.string_value()","false","true"
                                       ,in_R9);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)local_140,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                       ,0x2e,(char *)local_218._0_8_);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)local_140,(Message *)local_f8);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)local_140);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_218._0_8_ !=
                                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)&local_208) {
                              operator_delete((void *)local_218._0_8_,(long)local_208._M_buckets + 1
                                             );
                            }
                            testing::Message::~Message((Message *)local_f8);
                            pAVar3 = (AssertionResult *)local_1d0;
                          }
                          else {
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0)
                            ;
                            local_f8[0] = local_300.m_serialized_value == local_188._12_4_;
                            stack0xffffffffffffff10 =
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x0;
                            if (local_300.m_serialized_value == local_188._12_4_) {
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_f8);
                              local_1d0 = (undefined1  [8])local_1c0;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_1d0,"7281986","");
                              local_f8._0_8_ = local_e8;
                              std::__cxx11::string::_M_construct<char*>
                                        ((string *)local_f8,local_1d0,
                                         (char *)((long)local_1d0 +
                                                 (long)&(local_1c8.ptr_)->_M_dataplus));
                              database::Date::With_mmddyyyy
                                        ((Date *)local_218,(ComparableString *)local_f8);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_f8._0_8_ != local_e8) {
                                operator_delete((void *)local_f8._0_8_,
                                                local_e8[0]._M_allocated_capacity + 1);
                              }
                              if (local_1d0 != (undefined1  [8])local_1c0) {
                                operator_delete((void *)local_1d0,
                                                local_1c0[0]._M_allocated_capacity + 1);
                              }
                              local_1d0._0_4_ = 7;
                              local_140._0_4_ = 0x1c;
                              local_3d8._M_dataplus._M_p._0_4_ = 0x7c2;
                              database::Date::Date
                                        ((Date *)local_f8,(int32_t *)&local_3d8,(int32_t *)local_1d0
                                         ,(int32_t *)local_140);
                              bVar2 = local_218._8_4_ == local_f8._8_4_;
                              bVar5 = local_218._0_8_ == local_f8._0_8_;
                              bVar6 = bVar2 && bVar5;
                              local_140[0] = bVar6;
                              stack0xfffffffffffffec8 =
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)0x0;
                              if (bVar6) {
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_140);
LAB_0010a2c3:
                                database::Date::string_value
                                          ((ComparableString *)local_1d0,(Date *)local_218);
                                database::Date::string_value
                                          ((ComparableString *)local_140,(Date *)local_f8);
                                bVar2 = database::ComparableString::operator==
                                                  ((ComparableString *)local_1d0,
                                                   (ComparableString *)local_140);
                                local_3d8._M_dataplus._M_p._0_1_ = bVar2;
                                local_3d8._M_string_length = 0;
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_140._0_8_ != local_130) {
                                  operator_delete((void *)local_140._0_8_,
                                                  local_130[0]._M_allocated_capacity + 1);
                                }
                                if (local_1d0 != (undefined1  [8])local_1c0) {
                                  operator_delete((void *)local_1d0,
                                                  local_1c0[0]._M_allocated_capacity + 1);
                                }
                                if ((char)local_3d8._M_dataplus._M_p == '\0') {
                                  testing::Message::Message((Message *)local_140);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)local_1d0,(internal *)&local_3d8,
                                             (AssertionResult *)
                                             "date9.string_value() == date10.string_value()","false"
                                             ,"true",in_R9);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&local_320,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                             ,0x34,(char *)local_1d0);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&local_320,(Message *)local_140);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&local_320);
                                  if (local_1d0 != (undefined1  [8])local_1c0) {
                                    operator_delete((void *)local_1d0,
                                                    local_1c0[0]._M_allocated_capacity + 1);
                                  }
                                  testing::Message::~Message((Message *)local_140);
                                }
                                else {
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)&local_3d8);
                                  local_140[0] = local_218._12_4_ == iStack_ec;
                                  stack0xfffffffffffffec8 =
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)0x0;
                                  if (local_218._12_4_ == iStack_ec) {
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_140);
                                    paVar1 = &local_3d8.field_2;
                                    local_3d8._M_dataplus._M_p = (pointer)paVar1;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_3d8,"19022014","");
                                    local_140._0_8_ = local_130;
                                    std::__cxx11::string::_M_construct<char*>
                                              ((string *)local_140,local_3d8._M_dataplus._M_p,
                                               local_3d8._M_dataplus._M_p +
                                               local_3d8._M_string_length);
                                    database::Date::With_ddmmyyyy
                                              ((Date *)local_1d0,(ComparableString *)local_140);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_140._0_8_ != local_130) {
                                      operator_delete((void *)local_140._0_8_,
                                                      local_130[0]._M_allocated_capacity + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_3d8._M_dataplus._M_p != paVar1) {
                                      operator_delete(local_3d8._M_dataplus._M_p,
                                                      local_3d8.field_2._M_allocated_capacity + 1);
                                    }
                                    local_3d8._M_dataplus._M_p._0_4_ = 0x13;
                                    local_320.m_string._M_dataplus._M_p._0_1_ = true;
                                    local_320.m_string._M_dataplus._M_p._1_3_ = 0;
                                    local_270.success_ = true;
                                    local_270._1_3_ = 7;
                                    database::Date::Date
                                              ((Date *)local_140,(int32_t *)&local_270,
                                               (int32_t *)&local_320,(int32_t *)&local_3d8);
                                    bVar2 = (int)local_1c8.ptr_ == local_140._8_4_;
                                    bVar5 = local_1d0 == (undefined1  [8])local_140._0_8_;
                                    bVar6 = bVar2 && bVar5;
                                    local_320.m_string._M_dataplus._M_p._0_1_ = bVar6;
                                    local_320.m_string._M_string_length = 0;
                                    if (bVar6) {
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)&local_320);
LAB_0010a69b:
                                      database::Date::string_value
                                                ((ComparableString *)&local_3d8,(Date *)local_1d0);
                                      database::Date::string_value(&local_320,(Date *)local_140);
                                      bVar2 = database::ComparableString::operator==
                                                        ((ComparableString *)&local_3d8,&local_320);
                                      local_270.success_ = bVar2;
                                      local_270.message_.ptr_ =
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)0x0;
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)CONCAT44(local_320.m_string._M_dataplus._M_p._4_4_,
                                                      local_320.m_string._M_dataplus._M_p._0_4_) !=
                                          &local_320.m_string.field_2) {
                                        operator_delete((undefined1 *)
                                                        CONCAT44(local_320.m_string._M_dataplus._M_p
                                                                 ._4_4_,local_320.m_string.
                                                                        _M_dataplus._M_p._0_4_),
                                                        local_320.m_string.field_2.
                                                        _M_allocated_capacity + 1);
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_3d8._M_dataplus._M_p != paVar1) {
                                        operator_delete(local_3d8._M_dataplus._M_p,
                                                        local_3d8.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                      if (local_270.success_ == false) {
                                        testing::Message::Message((Message *)&local_320);
                                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                  (&local_3d8,(internal *)&local_270,
                                                   (AssertionResult *)
                                                   "date11.string_value() == date12.string_value()",
                                                   "false","true",in_R9);
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_3b8,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                                  ,0x3a,local_3d8._M_dataplus._M_p);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_3b8,(Message *)&local_320);
                                        testing::internal::AssertHelper::~AssertHelper(&local_3b8);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_3d8._M_dataplus._M_p != paVar1) {
                                          operator_delete(local_3d8._M_dataplus._M_p,
                                                          local_3d8.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        testing::Message::~Message((Message *)&local_320);
                                        pAVar3 = &local_270;
                                      }
                                      else {
                                        testing::AssertionResult::~AssertionResult(&local_270);
                                        local_320.m_string._M_dataplus._M_p._0_1_ =
                                             local_1c8.ptr_._4_4_ == iStack_134;
                                        local_320.m_string._M_string_length = 0;
                                        if (local_1c8.ptr_._4_4_ != iStack_134) {
                                          testing::Message::Message((Message *)&local_270);
                                          testing::internal::
                                          GetBoolAssertionFailureMessage_abi_cxx11_
                                                    (&local_3d8,(internal *)&local_320,
                                                     (AssertionResult *)
                                                                                                          
                                                  "date11.serialized_value() == date12.serialized_value()"
                                                  ,"false","true",in_R9);
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&local_3b8,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                                  ,0x3b,local_3d8._M_dataplus._M_p);
                                          testing::internal::AssertHelper::operator=
                                                    (&local_3b8,(Message *)&local_270);
                                          testing::internal::AssertHelper::~AssertHelper(&local_3b8)
                                          ;
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_3d8._M_dataplus._M_p != paVar1) {
                                            operator_delete(local_3d8._M_dataplus._M_p,
                                                            local_3d8.field_2._M_allocated_capacity
                                                            + 1);
                                          }
                                          testing::Message::~Message((Message *)&local_270);
                                        }
                                        pAVar3 = (AssertionResult *)&local_320;
                                      }
                                      testing::AssertionResult::~AssertionResult(pAVar3);
                                    }
                                    else {
                                      testing::Message::Message((Message *)&local_270);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                (&local_3d8,(internal *)&local_320,
                                                 (AssertionResult *)"date11 == date12","false",
                                                 "true",in_R9);
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_3b8,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                                 ,0x39,local_3d8._M_dataplus._M_p);
                                      testing::internal::AssertHelper::operator=
                                                (&local_3b8,(Message *)&local_270);
                                      testing::internal::AssertHelper::~AssertHelper(&local_3b8);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_3d8._M_dataplus._M_p != paVar1) {
                                        operator_delete(local_3d8._M_dataplus._M_p,
                                                        local_3d8.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                      testing::Message::~Message((Message *)&local_270);
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)&local_320);
                                      if (bVar2 && bVar5) goto LAB_0010a69b;
                                    }
                                    std::
                                    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                    ::~_Hashtable((
                                                  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                                  *)local_130);
                                    std::
                                    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                    ::~_Hashtable((
                                                  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                                  *)local_1c0);
                                    goto LAB_0010a8b1;
                                  }
                                  testing::Message::Message((Message *)&local_3d8);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)local_1d0,(internal *)local_140,
                                             (AssertionResult *)
                                             "date9.serialized_value() == date10.serialized_value()"
                                             ,"false","true",in_R9);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&local_320,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                             ,0x35,(char *)local_1d0);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&local_320,(Message *)&local_3d8);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&local_320);
                                  if (local_1d0 != (undefined1  [8])local_1c0) {
                                    operator_delete((void *)local_1d0,
                                                    local_1c0[0]._M_allocated_capacity + 1);
                                  }
                                  testing::Message::~Message((Message *)&local_3d8);
                                  this_00 = (string *)local_140;
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)this_00);
                              }
                              else {
                                testing::Message::Message((Message *)&local_3d8);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_1d0,(internal *)local_140,
                                           (AssertionResult *)"date9 == date10","false","true",in_R9
                                          );
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&local_320,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                           ,0x33,(char *)local_1d0);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&local_320,(Message *)&local_3d8);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&local_320);
                                if (local_1d0 != (undefined1  [8])local_1c0) {
                                  operator_delete((void *)local_1d0,
                                                  local_1c0[0]._M_allocated_capacity + 1);
                                }
                                testing::Message::~Message((Message *)&local_3d8);
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_140);
                                if (bVar2 && bVar5) goto LAB_0010a2c3;
                              }
LAB_0010a8b1:
                              std::
                              _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                              ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                             *)local_e8);
                              std::
                              _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                              ::~_Hashtable(&local_208);
                              goto LAB_0010a8cb;
                            }
                            testing::Message::Message((Message *)local_1d0);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_218,(internal *)local_f8,
                                       (AssertionResult *)
                                       "date7.serialized_value() == date8.serialized_value()",
                                       "false","true",in_R9);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)local_140,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                       ,0x2f,(char *)local_218._0_8_);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)local_140,(Message *)local_1d0);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)local_140);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_218._0_8_ !=
                                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)&local_208) {
                              operator_delete((void *)local_218._0_8_,(long)local_208._M_buckets + 1
                                             );
                            }
                            testing::Message::~Message((Message *)local_1d0);
                            pAVar3 = (AssertionResult *)local_f8;
                          }
                          testing::AssertionResult::~AssertionResult(pAVar3);
                        }
                        else {
                          testing::Message::Message((Message *)local_1d0);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)local_218,(internal *)local_f8,
                                     (AssertionResult *)"date7 == date8","false","true",in_R9);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)local_140,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                     ,0x2d,(char *)local_218._0_8_);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)local_140,(Message *)local_1d0);
                          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_140);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_218._0_8_ !=
                              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)&local_208) {
                            operator_delete((void *)local_218._0_8_,(long)local_208._M_buckets + 1);
                          }
                          testing::Message::~Message((Message *)local_1d0);
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
                          if (local_300.m_year == local_188._8_4_ && bVar2) goto LAB_00109ea2;
                        }
LAB_0010a8cb:
                        std::
                        _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::~_Hashtable(&local_178);
                        std::
                        _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::~_Hashtable(&local_300.m_days_of_months._M_h);
                      }
                      std::
                      _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::~_Hashtable(&local_2b8.m_days_of_months._M_h);
                    }
                    std::
                    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::~_Hashtable(&local_3b0.m_days_of_months._M_h);
                  }
                  std::
                  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::~_Hashtable(&local_358);
                }
              }
            }
          }
          std::
          _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&local_250);
        }
      }
    }
  }
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_a0);
LAB_00109b43:
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68.m_days_of_months._M_h);
  return;
}

Assistant:

TEST(DateTests,canCreateDates)
{
  database::Date date1 = database::Date::With_yyyy_mm_dd(2017,04,12);
  ASSERT_EQ(date1.day(),12);
  ASSERT_EQ(date1.month(),04);
  ASSERT_EQ(date1.year(),2017);
  ASSERT_EQ(date1.serialized_value(),20170412);

  database::Date date2 = database::Date::With_yyyymmdd(20031202);
  ASSERT_EQ(date2.day(),02);
  ASSERT_EQ(date2.month(),12);
  ASSERT_EQ(date2.year(),2003);
  ASSERT_EQ(date2.serialized_value(),20031202);

  database::Date date3 = database::Date::With_mm_dd_yyyy(10,05,1998);
  ASSERT_EQ(date3.day(),05);
  ASSERT_EQ(date3.month(),10);
  ASSERT_EQ(date3.year(),1998);
  ASSERT_EQ(date3.serialized_value(),19981005);

  database::Date date4 = database::Date::With_mmddyyyy(7281986);
  ASSERT_EQ(date4.day(),28);
  ASSERT_EQ(date4.month(),7);
  ASSERT_EQ(date4.year(),1986);
  ASSERT_EQ(date4.serialized_value(),19860728);

  database::Date date5 = database::Date::With_dd_mm_yyyy(1,11,2001);
  ASSERT_EQ(date5.day(),1);
  ASSERT_EQ(date5.month(),11);
  ASSERT_EQ(date5.year(),2001);
  ASSERT_EQ(date5.serialized_value(),20011101);

  database::Date date6 = database::Date::With_ddmmyyyy(19022014);
  ASSERT_EQ(date6.day(),19);
  ASSERT_EQ(date6.month(),02);
  ASSERT_EQ(date6.year(),2014);
  ASSERT_EQ(date6.serialized_value(),20140219);

  database::Date date7 = database::Date::With_yyyymmdd((std::string)"20031202");
  database::Date date8 = database::Date::With_yyyy_mm_dd(2003,12,02);
  ASSERT_TRUE(date7 == date8);
  ASSERT_TRUE(date7.string_value() == date8.string_value());
  ASSERT_TRUE(date7.serialized_value() == date8.serialized_value());

  database::Date date9 = database::Date::With_mmddyyyy((std::string)"7281986");
  database::Date date10 = database::Date::With_mm_dd_yyyy(07,28,1986);
  ASSERT_TRUE(date9 == date10);
  ASSERT_TRUE(date9.string_value() == date10.string_value());
  ASSERT_TRUE(date9.serialized_value() == date10.serialized_value());

  database::Date date11 = database::Date::With_ddmmyyyy((std::string)"19022014");
  database::Date date12 = database::Date::With_dd_mm_yyyy(19,02,2014);
  ASSERT_TRUE(date11 == date12);
  ASSERT_TRUE(date11.string_value() == date12.string_value());
  ASSERT_TRUE(date11.serialized_value() == date12.serialized_value());
}